

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

int __thiscall HModel::util_chgRowBoundsAll(HModel *this,double *XrowLower,double *XrowUpper)

{
  bool bVar1;
  reference pvVar2;
  long in_RDX;
  long in_RSI;
  HModel *in_RDI;
  double upper;
  double lower;
  int row;
  int in_stack_ffffffffffffff8c;
  HModel *in_stack_ffffffffffffff90;
  HModel *local_60;
  double local_48;
  int local_24;
  
  local_24 = 0;
  while( true ) {
    if (in_RDI->numRow <= local_24) {
      mlFg_Update(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      return 0;
    }
    local_48 = *(double *)(in_RSI + (long)local_24 * 8);
    local_60 = *(HModel **)(in_RDX + (long)local_24 * 8);
    bVar1 = hsol_isInfinity(in_RDI,local_48);
    if (bVar1) break;
    bVar1 = hsol_isInfinity(in_RDI,-(double)local_60);
    if (bVar1) {
      return -(local_24 + 1);
    }
    bVar1 = hsol_isInfinity(in_RDI,-local_48);
    if (!bVar1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->rowScale,(long)local_24);
      local_48 = local_48 / *pvVar2;
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->rowLower,(long)local_24);
    *pvVar2 = local_48;
    bVar1 = hsol_isInfinity(in_RDI,(double)local_60);
    if (!bVar1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->rowScale,(long)local_24);
      local_60 = (HModel *)((double)local_60 / *pvVar2);
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->rowUpper,(long)local_24);
    *pvVar2 = (value_type)local_60;
    local_24 = local_24 + 1;
    in_stack_ffffffffffffff90 = local_60;
  }
  return local_24 + 1;
}

Assistant:

int HModel::util_chgRowBoundsAll(const double* XrowLower, const double* XrowUpper) {
  assert(XrowLower != NULL);
  assert(XrowUpper != NULL);
  for (int row = 0; row < numRow; ++row) {
    double lower = XrowLower[row];
    double upper = XrowUpper[row];
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(lower)) return row+1;
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(-upper)) return -(row+1);
    rowLower[row] = (hsol_isInfinity(-lower) ? lower : lower / rowScale[row]);
    rowUpper[row] = (hsol_isInfinity( upper) ? upper : upper / rowScale[row]);
  }
  //Deduce the consequences of new bounds
  mlFg_Update(mlFg_action_NewBounds);
  return 0;  
}